

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O3

int handlessc32interface(RS232PORT *pSSC32InterfacePseudoRS232Port)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  char *pcVar6;
  double *pdVar7;
  void *__buf;
  bool bVar8;
  double dVar9;
  int pw;
  int chan;
  char recvbuf [512];
  int local_240;
  int local_23c;
  timespec local_238 [32];
  
  local_23c = 0;
  local_240 = 0;
  if (pSSC32InterfacePseudoRS232Port->DevType - 1U < 4) {
    local_238[0].tv_sec = 0;
    iVar3 = ioctl(pSSC32InterfacePseudoRS232Port->s,0x541b,local_238);
    bVar8 = local_238[0].tv_sec == 0;
  }
  else {
    if (pSSC32InterfacePseudoRS232Port->DevType != 0) goto LAB_001869ed;
    local_238[0].tv_sec = local_238[0].tv_sec & 0xffffffff00000000;
    iVar3 = ioctl(*(int *)&pSSC32InterfacePseudoRS232Port->hDev,0x541b,local_238);
    bVar8 = (int)local_238[0].tv_sec < 1;
  }
  if ((iVar3 == 0) && (!bVar8)) {
    uVar4 = 0;
    memset(local_238,0,0x200);
    do {
      if (uVar4 != 0) {
        if (*(char *)((long)&local_238[0].tv_sec + (ulong)(uVar4 - 1)) == '\r') {
          pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
          pcVar6 = strchr((char *)local_238,0x23);
          if (pcVar6 == (char *)0x0) goto LAB_00186dc5;
          goto LAB_00186ae3;
        }
        if (0x1ff < uVar4) {
          return 1;
        }
      }
      __buf = (void *)((long)&local_238[0].tv_sec + (ulong)uVar4);
      if (pSSC32InterfacePseudoRS232Port->DevType - 1U < 4) {
        sVar5 = recv(pSSC32InterfacePseudoRS232Port->s,__buf,1,0);
        iVar3 = (int)sVar5;
      }
      else {
        if (pSSC32InterfacePseudoRS232Port->DevType != 0) {
          return 1;
        }
        sVar5 = read(*(int *)&pSSC32InterfacePseudoRS232Port->hDev,__buf,1);
        iVar3 = (int)sVar5;
      }
      if (iVar3 < 1) {
        return 1;
      }
      uVar4 = iVar3 + uVar4;
    } while( true );
  }
LAB_001869ed:
  local_238[0].tv_sec = 0;
  local_238[0].tv_nsec = 50000000;
  nanosleep(local_238,(timespec *)0x0);
  return 0;
LAB_00186ae3:
  iVar3 = __isoc99_sscanf(pcVar6,"#%dP%d",&local_23c,&local_240);
  if (iVar3 == 2) {
    bVar8 = false;
    if (local_23c == 0) {
      pdVar7 = &ssc32_u1;
LAB_00186b4c:
      bVar1 = false;
      bVar8 = false;
      goto LAB_00186b4e;
    }
    switch(local_23c) {
    case 1:
      bVar1 = true;
      pdVar7 = &ssc32_u2;
      bVar8 = false;
      break;
    case 2:
      bVar1 = false;
      pdVar7 = &ssc32_u3;
      bVar8 = true;
      break;
    case 3:
      bVar2 = true;
      bVar8 = false;
      pdVar7 = &ssc32_u4;
      bVar1 = false;
      goto LAB_00186b50;
    case 4:
      pdVar7 = &ssc32_u5;
      goto LAB_00186b4c;
    default:
      bVar1 = false;
      bVar2 = false;
      goto LAB_00186b6d;
    }
LAB_00186b4e:
    bVar2 = false;
LAB_00186b50:
    *pdVar7 = ((double)local_240 + -1500.0) / 500.0;
LAB_00186b6d:
    if (robid < 0x8000) {
      if (0x1fff < robid) {
        if ((robid != 0x2000) && (robid != 0x4000)) goto LAB_00186d1f;
LAB_00186be0:
        if (bVar8) {
          u = ((double)local_240 + -1500.0) / 500.0;
        }
        if (local_23c != 0) goto LAB_00186c81;
        dVar9 = ((double)local_240 + -1500.0) / 500.0;
        goto LAB_00186c76;
      }
      if (robid == 0x200) goto LAB_00186c3f;
      if (robid == 0x1000) goto LAB_00186be0;
LAB_00186d1f:
      if (local_23c == 0) {
        uw = ((double)local_240 + -1500.0) / 500.0;
      }
      if (bVar1) {
        u = ((double)local_240 + -1500.0) / 500.0;
      }
      if (bVar8) {
        uv = ((double)local_240 + -1500.0) / 500.0;
      }
      if (!bVar2) goto LAB_00186c81;
      dVar9 = ((double)local_240 + -1500.0) / 500.0;
      pdVar7 = &ul;
    }
    else {
      if (robid < 0x20000) {
        if (robid == 0x8000) {
          if (local_23c == 0) {
            uw = ((double)local_240 + -1500.0) / 500.0;
          }
          if (!bVar1) goto LAB_00186c81;
          dVar9 = ((double)local_240 + -1500.0) / 500.0;
          pdVar7 = &u;
          goto LAB_00186c7d;
        }
        if (robid != 0x10000) goto LAB_00186d1f;
      }
      else if (robid != 0x20000) {
        if ((robid == 0x200000) || (robid == 0x100000)) goto LAB_00186be0;
        goto LAB_00186d1f;
      }
LAB_00186c3f:
      u = (ssc32_u2 + ssc32_u3) * 0.5;
      dVar9 = (ssc32_u2 - ssc32_u3) * 0.5;
LAB_00186c76:
      pdVar7 = &uw;
    }
LAB_00186c7d:
    *pdVar7 = dVar9;
  }
LAB_00186c81:
  if ((0x1fd < (long)local_238 - (long)pcVar6) ||
     (pcVar6 = strchr(pcVar6 + 1,0x23), pcVar6 == (char *)0x0)) {
LAB_00186dc5:
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    return 0;
  }
  goto LAB_00186ae3;
}

Assistant:

int handlessc32interface(RS232PORT* pSSC32InterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_SSC32];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_SSC32, chan = 0, pw = 0;
	char endchar = '\r';
	char* tmp = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pSSC32InterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pSSC32InterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		tmp = strstr(recvbuf, "#");
		while (tmp)
		{
			if (sscanf(tmp, "#%dP%d", &chan, &pw) == 2)
			{
				if (chan == 0) ssc32_u1 = (pw-1500.0)/500.0;
				if (chan == 1) ssc32_u2 = (pw-1500.0)/500.0;
				if (chan == 2) ssc32_u3 = (pw-1500.0)/500.0;
				if (chan == 3) ssc32_u4 = (pw-1500.0)/500.0;
				if (chan == 4) ssc32_u5 = (pw-1500.0)/500.0;
				switch (robid)
				{
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
					if (chan == 2) u = (pw-1500.0)/500.0;
					if (chan == 0) uw = (pw-1500.0)/500.0;
					break;
				case SAILBOAT2_ROBID:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
					// To be compatible with default parameters of SSC320.txt...
					u = (ssc32_u2+ssc32_u3)/2;
					uw = (ssc32_u2-ssc32_u3)/2;
					break;
				case QUADRO_SIMULATOR_ROBID:
				case COPTER_ROBID:
				case ARDUCOPTER_ROBID:
				default:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					if (chan == 2) uv = (pw-1500.0)/500.0;
					if (chan == 3) ul = (pw-1500.0)/500.0;
					break;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_SSC32-2) break;
			tmp = strstr(tmp+1, "#");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}